

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.cc
# Opt level: O0

void __thiscall
xemmai::t_thread::t_internal::f_initialize(t_internal *this,size_t a_stack,void *a_bottom)

{
  t_internal *this_00;
  pthread_t pVar1;
  long in_FS_OFFSET;
  void *a_bottom_local;
  size_t a_stack_local;
  t_internal *this_local;
  
  *(t_internal **)(in_FS_OFFSET + -0x28) = this;
  *(t_increments **)(in_FS_OFFSET + -0x68) = &this->v_increments;
  *(t_decrements **)(in_FS_OFFSET + -0x70) = &this->v_decrements;
  this_00 = (t_internal *)operator_new(0x440);
  t_fiber::t_internal::t_internal(this_00,a_stack,a_bottom);
  this->v_active = this_00;
  f_stack__(this->v_active->v_estack_used);
  pVar1 = pthread_self();
  this->v_handle = pVar1;
  this->v_done = 0;
  return;
}

Assistant:

void t_thread::t_internal::f_initialize(size_t a_stack, void* a_bottom)
{
	v_current = this;
	t_slot::t_increments::v_instance = &v_increments;
	t_slot::t_decrements::v_instance = &v_decrements;
	v_active = new t_fiber::t_internal(a_stack, a_bottom);
#ifdef __unix__
	f_stack__(v_active->v_estack_used);
	v_handle = pthread_self();
#endif
#ifdef _WIN32
	t_fiber::v_current = v_active;
	if (!DuplicateHandle(GetCurrentProcess(), GetCurrentThread(), GetCurrentProcess(), &v_handle, 0, FALSE, DUPLICATE_SAME_ACCESS)) throw std::system_error(GetLastError(), std::system_category());
#endif
	v_done = 0;
}